

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O1

void dasm_put(BuildCtx *ctx,int start,...)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  dasm_State *pdVar5;
  dasm_ActList puVar6;
  dasm_Section *pdVar7;
  bool bVar8;
  ulong uVar9;
  int iVar10;
  char in_AL;
  int *piVar11;
  undefined8 in_RCX;
  ulong __size;
  undefined8 in_RDX;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  int *piVar17;
  long lVar18;
  void **ppvVar19;
  uint *puVar20;
  undefined8 in_R8;
  undefined8 in_R9;
  int iVar21;
  byte *pbVar22;
  byte *pbVar23;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  void **local_100;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  pdVar5 = ctx->D;
  puVar6 = pdVar5->actionlist;
  pdVar7 = pdVar5->section;
  uVar12 = pdVar7->pos;
  iVar15 = pdVar7->ofs;
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (pdVar7->epos <= (int)uVar12) {
    uVar14 = pdVar7->bsize;
    if (uVar14 < 0xffffffffffffff38) {
      uVar9 = 0x10;
      if (0x10 < uVar14) {
        uVar9 = uVar14;
      }
      do {
        __size = uVar9;
        uVar9 = __size * 2;
      } while (__size < uVar14 + 200);
      piVar11 = (int *)realloc(pdVar7->buf,__size);
      pdVar7->buf = piVar11;
      if (piVar11 == (int *)0x0) {
        exit(1);
      }
      pdVar7->bsize = __size;
    }
    pdVar7->rbuf = pdVar7->buf + -(ulong)(uVar12 & 0xff000000);
    pdVar7->epos = (int)((ulong)(long)(int)pdVar7->bsize >> 2) + (uVar12 & 0xff000000) + -0x19;
  }
  piVar11 = pdVar7->rbuf;
  iVar21 = uVar12 + 1;
  piVar11[(int)uVar12] = start;
  local_100 = &ap[0].overflow_arg_area;
  uVar12 = 0x10;
  pbVar22 = puVar6 + start;
  do {
    pbVar23 = pbVar22 + 1;
    bVar2 = *pbVar22;
    if (bVar2 < 0xe9) {
      iVar15 = iVar15 + 1;
      goto LAB_00105efa;
    }
    iVar13 = 0;
    switch(bVar2) {
    case 0xf4:
    case 0xf6:
      bVar3 = pbVar22[1];
      pbVar23 = pbVar22 + 2;
      piVar17 = (int *)((ulong)((uint)bVar3 * 4) + (long)pdVar5->lglabels);
      if (bVar3 < 0xf7) {
        if (((bVar3 < 10) && (-1 < *piVar17)) || (pdVar5->lgsize <= (ulong)bVar3 << 2))
        goto LAB_00105d47;
LAB_00105e25:
        iVar13 = *piVar17;
        if (-1 < iVar13) goto LAB_00105e2b;
        piVar11[iVar21] = -iVar13;
      }
      else {
        piVar1 = piVar17 + -0xf6;
        piVar17 = piVar17 + -0xf6;
        iVar13 = *piVar1;
        if (*piVar1 < 1) {
          iVar13 = 0;
        }
LAB_00105e2b:
        piVar11[iVar21] = iVar13;
        *piVar17 = iVar21;
      }
      iVar13 = iVar21 + 1;
      if ((bVar2 & 0xfe) == 0xf4) {
        iVar15 = iVar15 + 4;
        iVar10 = iVar21 + 2;
LAB_00105eee:
        iVar21 = iVar10;
        piVar11[iVar13] = iVar15;
        goto LAB_00105ef1;
      }
      iVar15 = iVar15 + 8;
      bVar8 = true;
      iVar21 = iVar13;
      iVar13 = 0;
      break;
    case 0xf5:
    case 0xf7:
      uVar14 = (ulong)uVar12;
      if (uVar14 < 0x29) {
        uVar12 = uVar12 + 8;
        ppvVar19 = (void **)((long)local_e8 + uVar14);
      }
      else {
        ppvVar19 = local_100;
        local_100 = local_100 + 1;
      }
      piVar17 = pdVar5->pclabels + *(int *)ppvVar19;
      if ((ulong)((long)piVar17 - (long)pdVar5->pclabels) < pdVar5->pcsize) goto LAB_00105e25;
      goto LAB_00105ec2;
    case 0xf8:
      pbVar23 = pbVar22 + 2;
      if ((ulong)pbVar22[1] * 4 < pdVar5->lgsize) {
        puVar20 = (uint *)(pdVar5->lglabels + pbVar22[1]);
LAB_00105ea4:
        uVar16 = *puVar20;
        while (0 < (int)uVar16) {
          piVar17 = pdVar5->sections[uVar16 >> 0x18].rbuf;
          uVar4 = piVar17[uVar16];
          piVar17[uVar16] = iVar21;
          uVar16 = uVar4;
        }
        *puVar20 = -iVar21;
        iVar10 = iVar21 + 1;
        iVar13 = iVar21;
        goto LAB_00105eee;
      }
LAB_00105d47:
      pbVar23 = pbVar22 + 2;
      pdVar5->status = ~*(uint *)&pdVar5->actionlist + (int)pbVar23 | 0x13000000;
      iVar13 = 1;
      bVar8 = false;
      break;
    case 0xf9:
      uVar14 = (ulong)uVar12;
      if (uVar14 < 0x29) {
        uVar12 = uVar12 + 8;
        ppvVar19 = (void **)((long)local_e8 + uVar14);
      }
      else {
        ppvVar19 = local_100;
        local_100 = local_100 + 1;
      }
      puVar20 = (uint *)(pdVar5->pclabels + *(int *)ppvVar19);
      if ((ulong)((long)puVar20 - (long)pdVar5->pclabels) < pdVar5->pcsize) goto LAB_00105ea4;
LAB_00105ec2:
      uVar16 = ~*(uint *)&pdVar5->actionlist + (int)pbVar23 | 0x14000000;
LAB_00105ed2:
      pdVar5->status = uVar16;
      bVar8 = false;
      iVar13 = 1;
      break;
    case 0xfa:
      pbVar23 = pbVar22 + 2;
      iVar15 = iVar15 + (uint)pbVar22[1];
      lVar18 = (long)iVar21;
      iVar21 = iVar21 + 1;
      piVar11[lVar18] = iVar15;
      goto LAB_00105dd6;
    case 0xfb:
      pbVar23 = pbVar22 + 3;
      iVar15 = iVar15 + 4;
      goto LAB_00105dd6;
    case 0xfc:
      pbVar23 = pbVar22 + 2;
      iVar15 = iVar15 + 1;
LAB_00105dd6:
      bVar8 = true;
      break;
    case 0xfd:
LAB_00105ef1:
      bVar8 = true;
      iVar13 = 0;
      break;
    case 0xfe:
      if ((int)(uint)*pbVar23 < pdVar5->maxsection) {
        pdVar5->section = pdVar5->sections + *pbVar23;
        goto switchD_00105bbf_caseD_ff;
      }
      uVar16 = ~*(uint *)&pdVar5->actionlist + (int)pbVar23 | 0x12000000;
      goto LAB_00105ed2;
    case 0xff:
switchD_00105bbf_caseD_ff:
      bVar8 = false;
      iVar13 = 0x25;
      break;
    default:
      if (0x28 < (ulong)uVar12) {
        piVar11[iVar21] = *(int *)local_100;
        (*(code *)(&DAT_0010c040 + *(int *)(&DAT_0010c040 + (ulong)(bVar2 - 0xe9) * 4)))();
        return;
      }
      piVar11[iVar21] = *(int *)((long)local_e8 + (ulong)uVar12);
      (*(code *)(&DAT_0010c040 + *(int *)(&DAT_0010c040 + (ulong)(bVar2 - 0xe9) * 4)))();
      return;
    }
    if (bVar8) {
LAB_00105efa:
      iVar13 = 0;
    }
    pbVar22 = pbVar23;
    if ((iVar13 != 0) && (iVar13 != 6)) {
      if (iVar13 == 0x25) {
        pdVar7->pos = iVar21;
        pdVar7->ofs = iVar15;
      }
      return;
    }
  } while( true );
}

Assistant:

void dasm_put(Dst_DECL, int start, ...)
{
  va_list ap;
  dasm_State *D = Dst_REF;
  dasm_ActList p = D->actionlist + start;
  dasm_Section *sec = D->section;
  int pos = sec->pos, ofs = sec->ofs, mrm = -1;
  int *b;

  if (pos >= sec->epos) {
    DASM_M_GROW(Dst, int, sec->buf, sec->bsize,
      sec->bsize + 2*DASM_MAXSECPOS*sizeof(int));
    sec->rbuf = sec->buf - DASM_POS2BIAS(pos);
    sec->epos = (int)sec->bsize/sizeof(int) - DASM_MAXSECPOS+DASM_POS2BIAS(pos);
  }

  b = sec->rbuf;
  b[pos++] = start;

  va_start(ap, start);
  while (1) {
    int action = *p++;
    if (action < DASM_DISP) {
      ofs++;
    } else if (action <= DASM_REL_A) {
      int n = va_arg(ap, int);
      b[pos++] = n;
      switch (action) {
      case DASM_DISP:
	if (n == 0) { if (mrm < 0) mrm = p[-2]; if ((mrm&7) != 5) break; }
	/* fallthrough */
      case DASM_IMM_DB: if (((n+128)&-256) == 0) goto ob; /* fallthrough */
      case DASM_REL_A: /* Assumes ptrdiff_t is int. !x64 */
      case DASM_IMM_D: ofs += 4; break;
      case DASM_IMM_S: CK(((n+128)&-256) == 0, RANGE_I); goto ob;
      case DASM_IMM_B: CK((n&-256) == 0, RANGE_I); ob: ofs++; break;
      case DASM_IMM_WB: if (((n+128)&-256) == 0) goto ob; /* fallthrough */
      case DASM_IMM_W: CK((n&-65536) == 0, RANGE_I); ofs += 2; break;
      case DASM_SPACE: p++; ofs += n; break;
      case DASM_SETLABEL: b[pos-2] = -0x40000000; break;  /* Neg. label ofs. */
      case DASM_VREG: CK((n&-16) == 0 && (n != 4 || (*p>>5) != 2), RANGE_VREG);
	if (*p < 0x40 && p[1] == DASM_DISP) mrm = n;
	if (*p < 0x20 && (n&7) == 4) ofs++;
	switch ((*p++ >> 3) & 3) {
	case 3: n |= b[pos-3]; /* fallthrough */
	case 2: n |= b[pos-2]; /* fallthrough */
	case 1: if (n <= 7) { b[pos-1] |= 0x10; ofs--; }
	}
	continue;
      }
      mrm = -1;
    } else {
      int *pl, n;
      switch (action) {
      case DASM_REL_LG:
      case DASM_IMM_LG:
	n = *p++; pl = D->lglabels + n;
	/* Bkwd rel or global. */
	if (n <= 246) { CK(n>=10||*pl<0, RANGE_LG); CKPL(lg, LG); goto putrel; }
	pl -= 246; n = *pl;
	if (n < 0) n = 0;  /* Start new chain for fwd rel if label exists. */
	goto linkrel;
      case DASM_REL_PC:
      case DASM_IMM_PC: pl = D->pclabels + va_arg(ap, int); CKPL(pc, PC);
      putrel:
	n = *pl;
	if (n < 0) {  /* Label exists. Get label pos and store it. */
	  b[pos] = -n;
	} else {
      linkrel:
	  b[pos] = n;  /* Else link to rel chain, anchored at label. */
	  *pl = pos;
	}
	pos++;
	ofs += 4;  /* Maximum offset needed. */
	if (action == DASM_REL_LG || action == DASM_REL_PC) {
	  b[pos++] = ofs;  /* Store pass1 offset estimate. */
	} else if (sizeof(ptrdiff_t) == 8) {
	  ofs += 4;
	}
	break;
      case DASM_LABEL_LG: pl = D->lglabels + *p++; CKPL(lg, LG); goto putlabel;
      case DASM_LABEL_PC: pl = D->pclabels + va_arg(ap, int); CKPL(pc, PC);
      putlabel:
	n = *pl;  /* n > 0: Collapse rel chain and replace with label pos. */
	while (n > 0) { int *pb = DASM_POS2PTR(D, n); n = *pb; *pb = pos; }
	*pl = -pos;  /* Label exists now. */
	b[pos++] = ofs;  /* Store pass1 offset estimate. */
	break;
      case DASM_ALIGN:
	ofs += *p++;  /* Maximum alignment needed (arg is 2**n-1). */
	b[pos++] = ofs;  /* Store pass1 offset estimate. */
	break;
      case DASM_EXTERN: p += 2; ofs += 4; break;
      case DASM_ESC: p++; ofs++; break;
      case DASM_MARK: mrm = p[-2]; break;
      case DASM_SECTION:
	n = *p; CK(n < D->maxsection, RANGE_SEC); D->section = &D->sections[n];
      case DASM_STOP: goto stop;
      }
    }
  }
stop:
  va_end(ap);
  sec->pos = pos;
  sec->ofs = ofs;
}